

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Generators<double> * __thiscall
Catch::Generators::makeGenerators<double,double>
          (Generators<double> *__return_storage_ptr__,Generators *this,double *val,
          double *moreGenerators)

{
  long *local_20;
  
  value<double>((Generators *)&local_20,(double *)this);
  Generators<double>::Generators<Catch::Generators::GeneratorWrapper<double>,double>
            (__return_storage_ptr__,(GeneratorWrapper<double> *)&local_20,val);
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }